

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcMem.c
# Opt level: O3

void Wlc_NtkTrace_rec(Wlc_Ntk_t *p,Wlc_Obj_t *pObj,int iFrame,Vec_Int_t *vMemObjs,Vec_Wrd_t *vValues
                     ,word ValueA,Vec_Int_t *vRes)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  Wlc_Obj_t *pObj_00;
  uint uVar5;
  long lVar6;
  anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *paVar7;
  ushort uVar8;
  ushort uVar9;
  
  lVar6 = ((long)pObj - (long)p->pObjs >> 3) * -0x5555555555555555;
  if (((int)lVar6 < 0) || (iVar1 = (p->vCopies).nSize, iVar1 <= (int)lVar6)) {
LAB_0036202c:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  do {
    uVar5 = (uint)lVar6;
    iVar2 = (p->vCopies).pArray[uVar5 & 0x7fffffff];
    if (((long)iVar2 < 0) || (iVar3 = vMemObjs->nSize, iVar3 <= iVar2)) goto LAB_0036202c;
    if (vMemObjs->pArray[iVar2] != uVar5) {
      __assert_fail("iObj == Vec_IntEntry(vMemObjs, iNum)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcMem.c"
                    ,0x311,
                    "void Wlc_NtkTrace_rec(Wlc_Ntk_t *, Wlc_Obj_t *, int, Vec_Int_t *, Vec_Wrd_t *, word, Vec_Int_t *)"
                   );
    }
    if (iFrame < 0) {
      __assert_fail("iFrame >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcMem.c"
                    ,0x312,
                    "void Wlc_NtkTrace_rec(Wlc_Ntk_t *, Wlc_Obj_t *, int, Vec_Int_t *, Vec_Wrd_t *, word, Vec_Int_t *)"
                   );
    }
    uVar9 = *(ushort *)pObj & 0x3f;
    if (uVar9 == 1) {
LAB_0036200b:
      uVar5 = iFrame * 2 | uVar5 << 0xb;
LAB_00362014:
      Vec_IntPush(vRes,uVar5);
      return;
    }
    uVar8 = *(ushort *)pObj & 0x3d;
    if ((iFrame == 0) && (uVar8 == 1)) {
      iVar1 = (p->vPis).nSize;
      uVar5 = (pObj->field_10).Fanins[1] - iVar1;
      if ((-1 < (int)uVar5) && ((int)uVar5 < p->vInits->nSize)) {
        iVar2 = p->vInits->pArray[uVar5];
        if ((-1 < (long)iVar2) && (iVar2 < iVar1)) {
          iVar1 = (p->vPis).pArray[iVar2];
          if ((iVar1 < 1) || (p->nObjsAlloc <= iVar1)) {
LAB_0036204b:
            __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlc.h"
                          ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
          }
          uVar5 = iVar1 << 0xb;
          goto LAB_00362014;
        }
      }
      goto LAB_0036202c;
    }
    if (uVar8 == 1) {
      if (uVar9 != 3) {
        __assert_fail("pObj->Type == WLC_OBJ_FO",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlc.h"
                      ,0x156,"Wlc_Obj_t *Wlc_ObjFo2Fi(Wlc_Ntk_t *, Wlc_Obj_t *)");
      }
      uVar5 = ((pObj->field_10).Fanins[1] + (p->vPos).nSize) - (p->vPis).nSize;
      if (((int)uVar5 < 0) || ((p->vCos).nSize <= (int)uVar5)) goto LAB_0036202c;
      iVar2 = (p->vCos).pArray[uVar5];
      lVar6 = (long)iVar2;
      if ((lVar6 < 1) || (p->nObjsAlloc <= iVar2)) goto LAB_0036204b;
      iFrame = iFrame + -1;
    }
    else {
      if (uVar9 != 7) {
        if (uVar9 != 0x37) {
          if (uVar9 != 8) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcMem.c"
                          ,0x32e,
                          "void Wlc_NtkTrace_rec(Wlc_Ntk_t *, Wlc_Obj_t *, int, Vec_Int_t *, Vec_Wrd_t *, word, Vec_Int_t *)"
                         );
          }
          Vec_WrdEntry(vValues,(iVar3 * iFrame + iVar2) * 3);
          __assert_fail("Value == 0 && Value == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcMem.c"
                        ,0x323,
                        "void Wlc_NtkTrace_rec(Wlc_Ntk_t *, Wlc_Obj_t *, int, Vec_Int_t *, Vec_Wrd_t *, word, Vec_Int_t *)"
                       );
        }
        uVar4 = (iVar3 * iFrame + iVar2) * 3 + 1;
        if (vValues->nSize <= (int)uVar4) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                        ,0x1ad,"word Vec_WrdEntry(Vec_Wrd_t *, int)");
        }
        if (vValues->pArray[uVar4] != ValueA) {
          pObj_00 = Wlc_ObjFanin0(p,pObj);
          Wlc_NtkTrace_rec(p,pObj_00,iFrame,vMemObjs,vValues,ValueA,vRes);
        }
        goto LAB_0036200b;
      }
      paVar7 = &pObj->field_10;
      if (2 < pObj->nFanins) {
        paVar7 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar7->pFanins[0];
      }
      lVar6 = (long)paVar7->Fanins[0];
      if ((lVar6 < 1) || (p->nObjsAlloc <= paVar7->Fanins[0])) goto LAB_0036204b;
    }
    pObj = p->pObjs + lVar6;
    if (iVar1 <= (int)lVar6) goto LAB_0036202c;
  } while( true );
}

Assistant:

void Wlc_NtkTrace_rec( Wlc_Ntk_t * p, Wlc_Obj_t * pObj, int iFrame, Vec_Int_t * vMemObjs, Vec_Wrd_t * vValues, word ValueA, Vec_Int_t * vRes )
{
    int iObj = Wlc_ObjId(p, pObj);
    int iNum = Wlc_ObjCopy( p, iObj );
    assert( iObj == Vec_IntEntry(vMemObjs, iNum) );
    assert( iFrame >= 0 );
    if ( Wlc_ObjIsPi(pObj) ) 
        Vec_IntPush( vRes, (iObj << 11) | (iFrame << 1) );
    else if ( Wlc_ObjIsCi(pObj) && iFrame == 0 ) 
    {
        int PiId = Vec_IntEntry(p->vInits, Wlc_ObjCiId(pObj)-Wlc_NtkPiNum(p) );
        int iPiObj = Wlc_ObjId( p, Wlc_NtkPi(p, PiId) );
        Vec_IntPush( vRes, (iPiObj << 11) | (iFrame << 1) );
    }
    else if ( Wlc_ObjIsCi(pObj) )
        Wlc_NtkTrace_rec( p, Wlc_ObjFo2Fi(p, pObj), iFrame - 1, vMemObjs, vValues, ValueA, vRes );
    else if ( Wlc_ObjType(pObj) == WLC_OBJ_BUF )
        Wlc_NtkTrace_rec( p, Wlc_ObjFanin0(p, pObj), iFrame, vMemObjs, vValues, ValueA, vRes );
    else if ( Wlc_ObjType(pObj) == WLC_OBJ_MUX )
    {
        int Index = 3*(iFrame*Vec_IntSize(vMemObjs) + iNum);
        int Value = (int)Vec_WrdEntry( vValues, Index );
        assert( Value == 0 && Value == 1 );
        Wlc_NtkTrace_rec( p, Value ? Wlc_ObjFanin2(p, pObj) : Wlc_ObjFanin1(p, pObj), iFrame, vMemObjs, vValues, ValueA, vRes );
        Vec_IntPush( vRes, (iObj << 11) | (iFrame << 1) | Value );
    }
    else if ( Wlc_ObjType(pObj) == WLC_OBJ_WRITE )
    {
        int Index = 3*(iFrame*Vec_IntSize(vMemObjs) + iNum);
        if ( Vec_WrdEntry(vValues, Index + 1) != ValueA ) // address 
            Wlc_NtkTrace_rec( p, Wlc_ObjFanin0(p, pObj), iFrame, vMemObjs, vValues, ValueA, vRes );
        Vec_IntPush( vRes, (iObj << 11) | (iFrame << 1) );
    }
    else assert( 0 );
}